

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

void Nwk_ObjPatchFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFaninOld,Nwk_Obj_t *pFaninNew)

{
  int iVar1;
  int iVar2;
  int Limit;
  int iFanin;
  int k;
  int i;
  Nwk_Obj_t *pFaninNew_local;
  Nwk_Obj_t *pFaninOld_local;
  Nwk_Obj_t *pObj_local;
  
  if (pFaninOld == pFaninNew) {
    __assert_fail("pFaninOld != pFaninNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0xea,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninOld) {
    __assert_fail("pObj != pFaninOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0xeb,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj == pFaninNew) {
    __assert_fail("pObj != pFaninNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0xec,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if (pObj->pMan == pFaninOld->pMan) {
    if (pObj->pMan == pFaninNew->pMan) {
      iVar2 = Nwk_ObjFindFanin(pObj,pFaninOld);
      if (iVar2 == -1) {
        printf("Nwk_ObjPatchFanin(); Error! Node %d is not among",(ulong)(uint)pFaninOld->Id);
        printf(" the fanins of node %d...\n",(ulong)(uint)pObj->Id);
      }
      else {
        pObj->pFanio[iVar2] = pFaninNew;
        iVar2 = pFaninOld->nFanins;
        iVar1 = pFaninOld->nFanouts;
        Limit = pFaninOld->nFanins;
        for (iFanin = Limit; iFanin < iVar2 + iVar1; iFanin = iFanin + 1) {
          if (pFaninOld->pFanio[iFanin] != pObj) {
            pFaninOld->pFanio[Limit] = pFaninOld->pFanio[iFanin];
            Limit = Limit + 1;
          }
        }
        pFaninOld->nFanouts = pFaninOld->nFanouts + -1;
        iVar2 = Nwk_ObjReallocIsNeeded(pFaninNew);
        if (iVar2 != 0) {
          Nwk_ManReallocNode(pFaninNew);
        }
        iVar2 = pFaninNew->nFanouts;
        pFaninNew->nFanouts = iVar2 + 1;
        pFaninNew->pFanio[pFaninNew->nFanins + iVar2] = pObj;
      }
      return;
    }
    __assert_fail("pObj->pMan == pFaninNew->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0xee,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  __assert_fail("pObj->pMan == pFaninOld->pMan",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                ,0xed,"void Nwk_ObjPatchFanin(Nwk_Obj_t *, Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjPatchFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFaninOld, Nwk_Obj_t * pFaninNew )
{
    int i, k, iFanin, Limit;
    assert( pFaninOld != pFaninNew );
    assert( pObj != pFaninOld );
    assert( pObj != pFaninNew );
    assert( pObj->pMan == pFaninOld->pMan );
    assert( pObj->pMan == pFaninNew->pMan );
    // update the fanin
    iFanin = Nwk_ObjFindFanin( pObj, pFaninOld );
    if ( iFanin == -1 )
    {
        printf( "Nwk_ObjPatchFanin(); Error! Node %d is not among", pFaninOld->Id );
        printf( " the fanins of node %d...\n", pObj->Id );
        return;
    }
    pObj->pFanio[iFanin] = pFaninNew;
    // remove pObj from the fanout list of pFaninOld
    Limit = pFaninOld->nFanins + pFaninOld->nFanouts;
    for ( k = i = pFaninOld->nFanins; i < Limit; i++ )
        if ( pFaninOld->pFanio[i] != pObj )
            pFaninOld->pFanio[k++] = pFaninOld->pFanio[i];
    pFaninOld->nFanouts--;
    // add pObj to the fanout list of pFaninNew
    if ( Nwk_ObjReallocIsNeeded(pFaninNew) )
        Nwk_ManReallocNode( pFaninNew );
    pFaninNew->pFanio[pFaninNew->nFanins + pFaninNew->nFanouts++] = pObj;
}